

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::WritePhonyBuild
          (cmGlobalNinjaGenerator *this,ostream *os,string *comment,cmNinjaDeps *outputs,
          cmNinjaDeps *explicitDeps,cmNinjaDeps *implicitDeps,cmNinjaDeps *orderOnlyDeps,
          cmNinjaVars *variables)

{
  cmNinjaDeps *implicitDeps_00;
  cmNinjaDeps *explicitDeps_00;
  cmNinjaDeps *outputs_00;
  string local_98;
  allocator local_61;
  string local_60;
  cmNinjaDeps *local_40;
  cmNinjaDeps *implicitDeps_local;
  cmNinjaDeps *explicitDeps_local;
  cmNinjaDeps *outputs_local;
  string *comment_local;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_40 = implicitDeps;
  implicitDeps_local = explicitDeps;
  explicitDeps_local = outputs;
  outputs_local = (cmNinjaDeps *)comment;
  comment_local = (string *)os;
  os_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"phony",&local_61);
  outputs_00 = explicitDeps_local;
  explicitDeps_00 = implicitDeps_local;
  implicitDeps_00 = local_40;
  std::__cxx11::string::string((string *)&local_98);
  WriteBuild(this,os,comment,&local_60,outputs_00,explicitDeps_00,implicitDeps_00,orderOnlyDeps,
             variables,&local_98,-1,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WritePhonyBuild(std::ostream& os,
                                             const std::string& comment,
                                             const cmNinjaDeps& outputs,
                                             const cmNinjaDeps& explicitDeps,
                                             const cmNinjaDeps& implicitDeps,
                                             const cmNinjaDeps& orderOnlyDeps,
                                             const cmNinjaVars& variables)
{
  this->WriteBuild(os,
                   comment,
                   "phony",
                   outputs,
                   explicitDeps,
                   implicitDeps,
                   orderOnlyDeps,
                   variables);
}